

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

PktOut * pq_out_after(PacketQueueBase *pqb,PacketQueueNode *prev,_Bool pop)

{
  PacketQueueBase *node;
  PktOut *pPVar1;
  
  node = (PacketQueueBase *)prev->next;
  if (node == pqb) {
    pPVar1 = (PktOut *)0x0;
  }
  else {
    if (pop) {
      pq_unlink_common(pqb,(PacketQueueNode *)node);
      (node->end).next = (PacketQueueNode *)0x0;
      (node->end).prev = (PacketQueueNode *)0x0;
    }
    pPVar1 = (PktOut *)&node[-2].total_size;
  }
  return pPVar1;
}

Assistant:

static PktOut *pq_out_after(PacketQueueBase *pqb,
                            PacketQueueNode *prev, bool pop)
{
    PacketQueueNode *node = prev->next;
    if (node == &pqb->end)
        return NULL;

    if (pop) {
        pq_unlink_common(pqb, node);

        node->prev = node->next = NULL;
    }

    return container_of(node, PktOut, qnode);
}